

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_P2wpkhAddressToConfidential_Test::
ElementsConfidentialAddress_P2wpkhAddressToConfidential_Test
          (ElementsConfidentialAddress_P2wpkhAddressToConfidential_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0045ffe0;
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2wpkhAddressToConfidential) {
  Address address;
  ElementsConfidentialAddress confidential_address;
  ConfidentialKey confidential_key(
      "02c63c841eae06932626118e77d4002baa14592aeabe5439cbe22e0654319d8e8c");

  EXPECT_NO_THROW(
      (address =
          Address(ElementsNetType::kElementsRegtest, WitnessVersion::kVersion0,
                  Pubkey("02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995"),
                  GetElementsAddressFormatList())));
  EXPECT_NO_THROW(
      (confidential_address =
          ElementsConfidentialAddress(address, confidential_key)));
  EXPECT_STREQ(
      "el1qqtrrepq74crfxf3xzx8804qq9w4pgkf2a2l9gwwtughqv4p3nk8gepg0y9q39qhjgmnyfwfz5z5c5ek0llwtc3jfqw5zvqx5q",
      confidential_address.GetAddress().c_str());
  EXPECT_STREQ(
      "02c63c841eae06932626118e77d4002baa14592aeabe5439cbe22e0654319d8e8c",
      confidential_address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("850f21411282f246e644b922a0a98a66cfffdcbc",
               confidential_address.GetHash().GetHex().c_str());
  EXPECT_STREQ("ert1qs58jzsgjsteydejyhy32p2v2vm8llh9uns6d93",
               confidential_address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(confidential_address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, confidential_address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2wpkhAddress, confidential_address.GetAddressType());
}